

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potions.cpp
# Opt level: O0

void hit_by_potion(int type,MonsterThing *mp)

{
  int iVar1;
  char *pcVar2;
  MonsterThing *mp_local;
  int type_local;
  
  switch(type) {
  case 0:
    iVar1 = save_throw(0,mp);
    if (iVar1 == 0) {
      mp->flags = mp->flags | 0x200;
    }
    break;
  case 1:
    iVar1 = save_throw(0,mp);
    if (iVar1 == 0) {
      mp->flags = mp->flags | 0x200;
    }
    break;
  case 2:
    iVar1 = save_throw(0,mp);
    if (iVar1 == 0) {
      iVar1 = roll(1,6);
      (mp->stats).s_hpt = (mp->stats).s_hpt - iVar1;
      iVar1 = roll(1,3);
      (mp->stats).s_str = (mp->stats).s_str - iVar1;
      pcVar2 = set_mname(mp);
      msg("%s melts from the liquid",pcVar2);
    }
    break;
  case 3:
    iVar1 = save_throw(0,mp);
    if (iVar1 == 0) {
      (mp->stats).s_str = (mp->stats).s_str + 1;
      pcVar2 = set_mname(mp);
      msg("%s looks stronger now...",pcVar2);
    }
    break;
  case 4:
    break;
  case 5:
    iVar1 = save_throw(0,mp);
    if (iVar1 == 0) {
      iVar1 = roll((mp->stats).s_lvl,4);
      iVar1 = iVar1 + (mp->stats).s_hpt;
      (mp->stats).s_hpt = iVar1;
      if ((mp->stats).s_maxhp < iVar1) {
        iVar1 = (mp->stats).s_maxhp + 1;
        (mp->stats).s_maxhp = iVar1;
        (mp->stats).s_hpt = iVar1;
      }
      pcVar2 = set_mname(mp);
      msg("%s looks refreshed",pcVar2);
    }
    break;
  case 6:
    break;
  case 7:
    break;
  case 8:
    break;
  case 9:
    iVar1 = save_throw(0,mp);
    if (iVar1 == 0) {
      iVar1 = roll((mp->stats).s_lvl,8);
      iVar1 = iVar1 + (mp->stats).s_hpt;
      (mp->stats).s_hpt = iVar1;
      if ((mp->stats).s_maxhp < iVar1) {
        iVar1 = (mp->stats).s_maxhp + 1;
        (mp->stats).s_maxhp = iVar1;
        (mp->stats).s_hpt = iVar1;
      }
      pcVar2 = set_mname(mp);
      msg("%s looks very refreshed",pcVar2);
    }
    break;
  case 10:
    break;
  case 0xb:
    break;
  case 0xc:
    break;
  case 0xd:
  }
  return;
}

Assistant:

void hit_by_potion(int type, MonsterThing* mp)
{
    switch(type)
    {
    case P_CONFUSE:
        if (!save_throw(VS_POISON, mp))
        {
            mp->flags |= ISHUH;
        }
    when P_LSD:
        if (!save_throw(VS_POISON, mp))
        {
            mp->flags |= ISHUH;
        }
    when P_POISON:
        if (!save_throw(VS_POISON, mp))
        {
            //Hit by a potion of poison. Do 1d6 damage. Plus 1d3 strength damage.
            mp->stats.s_hpt -= roll(1, 6);
            mp->stats.s_str -= roll(1, 3);
            msg("%s melts from the liquid", set_mname(mp));
        }
    when P_STRENGTH:
        if (!save_throw(VS_POISON, mp))
        {
            //Hit by a potion of strength, add a strength and tell the thrower that this was a bad move.
            mp->stats.s_str += 1;
            msg("%s looks stronger now...", set_mname(mp));
        }
    when P_SEEINVIS:
    when P_HEALING:
        if (!save_throw(VS_POISON, mp))
        {
            if ((mp->stats.s_hpt += roll(mp->stats.s_lvl, 4)) > mp->stats.s_maxhp)
                mp->stats.s_hpt = ++mp->stats.s_maxhp;
            msg("%s looks refreshed", set_mname(mp));
        }
    when P_MFIND:
    when P_TFIND:
    when P_RAISE:
    when P_XHEAL:
        if (!save_throw(VS_POISON, mp))
        {
            if ((mp->stats.s_hpt += roll(mp->stats.s_lvl, 8)) > mp->stats.s_maxhp)
                mp->stats.s_hpt = ++mp->stats.s_maxhp;
            msg("%s looks very refreshed", set_mname(mp));
        }
    when P_HASTE:
    when P_RESTORE:
    when P_BLIND:
    when P_LEVIT:
        break;
    }
}